

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::~ansicolor_sink
          (ansicolor_sink<spdlog::details::console_nullmutex> *this)

{
  sink *in_RDI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
  *unaff_retaddr;
  
  (((__uniq_ptr_data<spdlog::formatter,_std::default_delete<spdlog::formatter>,_true,_true> *)
   &in_RDI->_vptr_sink)->
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>)._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl =
       (formatter *)&PTR__ansicolor_sink_00304218;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>::
  ~array(unaff_retaddr);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RDI);
  sinks::sink::~sink(in_RDI);
  return;
}

Assistant:

~ansicolor_sink() override = default;